

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test9::getMatrixMultiplicationResult
          (GPUShaderFP64Test9 *this,_variable_type *matrix_a_type,
          vector<double,_std::allocator<double>_> *matrix_a_data,_variable_type *matrix_b_type,
          vector<double,_std::allocator<double>_> *matrix_b_data,double *out_result_ptr)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 *puVar16;
  double *pdVar17;
  double *pdVar18;
  pointer pdVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  TestError *this_00;
  double *pdVar23;
  undefined8 *puVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  undefined1 *puVar27;
  undefined1 *puVar28;
  long lVar29;
  bool bVar30;
  long lVar31;
  long lVar32;
  bool bVar33;
  undefined1 *puVar34;
  byte bVar35;
  double v;
  double dVar36;
  uint uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  bool bVar52;
  undefined8 uVar53;
  Matrix<double,_2,_3> res;
  Matrix<double,_2,_3> matrix_a_transposed;
  Matrix<double,_3,_2> matrix_b_transposed;
  Array<double,_4> a;
  Matrix<double,_2,_3> matrix_b;
  Matrix<double,_2,_4> matrix_b_transposed_1;
  undefined1 *apuStack_318 [4];
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  double local_238 [4];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  double dStack_190;
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  double dStack_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  double dStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined8 local_d8 [10];
  undefined1 local_88 [16];
  Vector<double,_2> local_78;
  Vector<double,_2> local_68;
  Vector<double,_2> local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  long lVar51;
  
  bVar35 = 0;
  pdVar17 = (double *)local_2f8;
  pdVar18 = (double *)local_2f8;
  puVar26 = local_2f8;
  puVar25 = local_2f8;
  puVar20 = local_2f8;
  puVar21 = local_2f8;
  puVar27 = local_2f8;
  puVar28 = local_2f8;
  puVar34 = local_2f8;
  puVar22 = local_2f8;
  pdVar23 = (double *)local_2f8;
  switch(*matrix_a_type) {
  case VARIABLE_TYPE_DMAT2:
    pdVar23 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar17 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_298._8_8_ = pdVar17[1] * pdVar23[3] + *pdVar17 * pdVar23[1] + 0.0;
    local_298._0_8_ = pdVar17[1] * pdVar23[2] + *pdVar17 * *pdVar23 + 0.0;
    dStack_100 = pdVar17[3] * pdVar23[3] + pdVar17[2] * pdVar23[1] + 0.0;
    local_108 = (undefined1  [8])(pdVar17[3] * pdVar23[2] + pdVar17[2] * *pdVar23 + 0.0);
    puVar24 = (undefined8 *)local_188;
    puVar16 = (undefined8 *)local_298;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      uVar53 = puVar16[1];
      *puVar24 = *puVar16;
      puVar24[1] = uVar53;
      puVar24 = puVar24 + 2;
      puVar16 = (undefined8 *)local_108;
      bVar52 = false;
    } while (bVar30);
    goto LAB_0093b75f;
  case VARIABLE_TYPE_DMAT2X3:
    pdVar19 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_e8 = ZEXT816(0);
    local_f8 = ZEXT816(0);
    _local_108 = ZEXT816(0);
    lVar29 = 0;
    puVar20 = local_108;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31 * 2) = *(undefined8 *)((long)pdVar19 + lVar31 + lVar29);
        lVar31 = lVar31 + 8;
      } while (lVar31 != 0x18);
      lVar29 = 0x18;
      puVar20 = local_108 + 8;
      bVar52 = false;
    } while (bVar30);
    local_1f8 = ZEXT816(0);
    local_208 = ZEXT816(0);
    local_218 = ZEXT816(0);
    lVar29 = 0;
    do {
      uVar53 = 0x3ff0000000000000;
      if (lVar29 != 0) {
        uVar53 = 0;
      }
      *(undefined8 *)(local_218 + lVar29 * 8) = uVar53;
      uVar53 = 0x3ff0000000000000;
      if (lVar29 != 1) {
        uVar53 = 0;
      }
      *(undefined8 *)(local_208 + lVar29 * 8 + 8) = uVar53;
      lVar29 = lVar29 + 1;
    } while (lVar29 != 3);
    pdVar19 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_2d8 = ZEXT816(0);
    local_2f8._16_8_ = 0.0;
    local_2f8._24_8_ = 0.0;
    local_2f8._0_8_ = 0.0;
    local_2f8._8_8_ = 0.0;
    lVar29 = 0;
    do {
      *(undefined8 *)(local_2f8 + lVar29) = *(undefined8 *)((long)pdVar19 + lVar29 * 2);
      *(undefined8 *)(local_2d8 + lVar29 + -8) = *(undefined8 *)((long)pdVar19 + lVar29 * 2 + 8);
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x18);
    local_68.m_data = (double  [2])ZEXT816(0);
    local_78.m_data = (double  [2])ZEXT816(0);
    local_88 = ZEXT816(0);
    lVar29 = 0;
    puVar20 = local_88;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar31 = 0;
      auVar43 = _DAT_019f34d0;
      do {
        bVar52 = SUB164(auVar43 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar43 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 * 0x10 != lVar31) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar31) = uVar53;
        }
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 * 0x10 + -0x10 != lVar31) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar31 + 0x10) = uVar53;
        }
        lVar32 = auVar43._8_8_;
        auVar43._0_8_ = auVar43._0_8_ + 2;
        auVar43._8_8_ = lVar32 + 2;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x40);
      lVar29 = 1;
      puVar20 = local_88 + 8;
      bVar52 = false;
    } while (bVar30);
    puVar20 = local_188;
    local_158 = (undefined1  [16])0x0;
    local_168 = (undefined1  [16])0x0;
    _local_178 = (undefined1  [16])0x0;
    local_188 = (undefined1  [16])0x0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_148._0_8_;
    local_148 = auVar14 << 0x40;
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      auVar44 = _DAT_019f34d0;
      do {
        bVar52 = SUB164(auVar44 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar44 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar32) = uVar53;
        }
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 + -0x18 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar32 + 0x18) = uVar53;
        }
        lVar51 = auVar44._8_8_;
        auVar44._0_8_ = auVar44._0_8_ + 2;
        auVar44._8_8_ = lVar51 + 2;
        lVar32 = lVar32 + 0x30;
      } while (lVar32 != 0x60);
      lVar31 = lVar31 + 1;
      lVar29 = lVar29 + 0x18;
      puVar20 = puVar20 + 8;
    } while (lVar31 != 3);
    local_278 = (undefined1  [16])0x0;
    local_288 = (undefined1  [16])0x0;
    local_298 = (undefined1  [16])0x0;
    lVar29 = 0;
    do {
      uVar53 = 0x3ff0000000000000;
      if (lVar29 != 0) {
        uVar53 = 0;
      }
      *(undefined8 *)(local_298 + lVar29 * 8) = uVar53;
      uVar53 = 0x3ff0000000000000;
      if (lVar29 != 1) {
        uVar53 = 0;
      }
      *(undefined8 *)(local_288 + lVar29 * 8 + 8) = uVar53;
      lVar29 = lVar29 + 1;
    } while (lVar29 != 3);
    puVar20 = local_298;
    puVar21 = local_108;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar29 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar29) = *(undefined8 *)(puVar21 + lVar29 * 2);
        lVar29 = lVar29 + 8;
      } while (lVar29 != 0x18);
      puVar20 = local_288 + 8;
      puVar21 = local_108 + 8;
      bVar52 = false;
    } while (bVar30);
    lVar29 = 0;
    do {
      uVar53 = *(undefined8 *)(local_288 + lVar29 * 8 + 8);
      *(undefined8 *)(local_218 + lVar29 * 8) = *(undefined8 *)(local_298 + lVar29 * 8);
      *(undefined8 *)(local_208 + lVar29 * 8 + 8) = uVar53;
      lVar29 = lVar29 + 1;
    } while (lVar29 != 3);
    local_278 = (undefined1  [16])0x0;
    local_288 = (undefined1  [16])0x0;
    local_298 = (undefined1  [16])0x0;
    lVar29 = 0;
    puVar20 = local_298;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar31 = 0;
      auVar45 = _DAT_019f34d0;
      do {
        bVar52 = SUB164(auVar45 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar45 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 * 0x10 != lVar31) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar31) = uVar53;
        }
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 * 0x10 + -0x10 != lVar31) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar31 + 0x10) = uVar53;
        }
        lVar32 = auVar45._8_8_;
        auVar45._0_8_ = auVar45._0_8_ + 2;
        auVar45._8_8_ = lVar32 + 2;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x40);
      lVar29 = 1;
      puVar20 = local_298 + 8;
      bVar52 = false;
    } while (bVar30);
    lVar29 = 0;
    do {
      uVar53 = *(undefined8 *)(local_2d8 + lVar29 + -8);
      *(undefined8 *)(local_298 + lVar29 * 2) = *(undefined8 *)(local_2f8 + lVar29);
      *(undefined8 *)(local_298 + lVar29 * 2 + 8) = uVar53;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x18);
    puVar20 = local_298;
    puVar21 = local_88;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar29 = 0;
      do {
        *(undefined8 *)(puVar21 + lVar29) = *(undefined8 *)(puVar20 + lVar29);
        lVar29 = lVar29 + 0x10;
      } while (lVar29 != 0x30);
      puVar20 = local_298 + 8;
      puVar21 = local_88 + 8;
      bVar52 = false;
    } while (bVar30);
    puVar20 = local_298;
    apuStack_318[3] = (undefined1 *)0x93bbfa;
    tcu::operator*((Matrix<double,_3,_2> *)local_218,(Matrix<double,_2,_3> *)local_88);
    puVar21 = local_188;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar21 + lVar31) = *(undefined8 *)(puVar20 + lVar31);
        lVar31 = lVar31 + 0x18;
      } while (lVar31 != 0x48);
      lVar29 = lVar29 + 1;
      puVar21 = puVar21 + 8;
      puVar20 = puVar20 + 8;
    } while (lVar29 != 3);
    puVar20 = local_298;
    puVar21 = local_188;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31) = *(undefined8 *)(puVar21 + lVar31);
        lVar31 = lVar31 + 8;
      } while (lVar31 != 0x18);
      lVar29 = lVar29 + 1;
      puVar21 = puVar21 + 0x18;
      puVar20 = puVar20 + 0x18;
    } while (lVar29 != 3);
    pdVar23 = (double *)local_298;
    break;
  case VARIABLE_TYPE_DMAT2X4:
    pdVar19 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_d8[0] = 0;
    local_d8[1] = 0;
    local_e8 = ZEXT816(0);
    local_f8 = ZEXT816(0);
    _local_108 = ZEXT816(0);
    lVar29 = 0;
    puVar24 = (undefined8 *)local_108;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar31 = 0;
      do {
        *(undefined8 *)((long)puVar24 + lVar31 * 2) =
             *(undefined8 *)((long)pdVar19 + lVar31 + lVar29);
        lVar31 = lVar31 + 8;
      } while (lVar31 != 0x20);
      lVar29 = 0x20;
      puVar24 = (undefined8 *)(local_108 + 8);
      bVar52 = false;
    } while (bVar30);
    local_218 = ZEXT816(0x3ff0000000000000);
    local_1f8._0_12_ = ZEXT812(0);
    local_1f8._12_4_ = 0x3ff00000;
    local_208 = ZEXT816(0);
    local_1e8 = ZEXT816(0);
    pdVar19 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_2c8 = ZEXT816(0);
    local_2d8 = ZEXT816(0);
    local_2f8._16_8_ = 0.0;
    local_2f8._24_8_ = 0.0;
    local_2f8._0_8_ = 0.0;
    local_2f8._8_8_ = 0.0;
    lVar29 = 0;
    do {
      puVar24 = (undefined8 *)((long)pdVar19 + lVar29 * 2);
      uVar53 = puVar24[1];
      puVar16 = (undefined8 *)((long)pdVar19 + lVar29 * 2 + 0x10);
      uVar3 = *puVar16;
      uVar4 = puVar16[1];
      *(undefined8 *)(local_2f8 + lVar29) = *puVar24;
      *(undefined8 *)(local_2f8 + lVar29 + 8) = uVar3;
      *(undefined8 *)(local_2d8 + lVar29) = uVar53;
      *(undefined8 *)(local_2d8 + lVar29 + 8) = uVar4;
      lVar29 = lVar29 + 0x10;
    } while (lVar29 != 0x20);
    local_58.m_data = (double  [2])ZEXT816(0);
    local_68.m_data = (double  [2])ZEXT816(0);
    local_78.m_data = (double  [2])ZEXT816(0);
    local_88 = ZEXT816(0);
    lVar29 = 0;
    puVar20 = local_88;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar31 = 0;
      do {
        uVar37 = 0x3ff00000;
        if (lVar29 * 0x10 != lVar31) {
          uVar37 = 0;
        }
        *(ulong *)(puVar20 + lVar31) = (ulong)uVar37 << 0x20;
        lVar31 = lVar31 + 0x10;
      } while (lVar31 != 0x40);
      lVar29 = 1;
      puVar20 = local_88 + 8;
      bVar52 = false;
    } while (bVar30);
    puVar20 = local_188;
    local_118 = ZEXT816(0);
    local_128 = ZEXT816(0);
    local_138 = ZEXT816(0);
    local_148 = ZEXT816(0);
    local_158 = ZEXT816(0);
    local_168 = ZEXT816(0);
    _local_178 = ZEXT816(0);
    local_188 = ZEXT816(0);
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      do {
        uVar37 = 0x3ff00000;
        if (lVar29 != lVar32) {
          uVar37 = 0;
        }
        *(ulong *)(puVar20 + lVar32) = (ulong)uVar37 << 0x20;
        lVar32 = lVar32 + 0x20;
      } while (lVar32 != 0x80);
      lVar31 = lVar31 + 1;
      puVar20 = puVar20 + 8;
      lVar29 = lVar29 + 0x20;
    } while (lVar31 != 4);
    local_298 = ZEXT816(0x3ff0000000000000);
    local_278 = ZEXT816(0x3ff0000000000000) << 0x40;
    local_288 = ZEXT816(0);
    local_268 = ZEXT816(0);
    puVar24 = (undefined8 *)local_298;
    puVar16 = (undefined8 *)local_108;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      uVar53 = puVar16[2];
      *puVar24 = *puVar16;
      puVar24[1] = uVar53;
      uVar53 = puVar16[6];
      puVar24[2] = puVar16[4];
      puVar24[3] = uVar53;
      puVar24 = (undefined8 *)local_278;
      puVar16 = (undefined8 *)(local_108 + 8);
      bVar52 = false;
    } while (bVar30);
    lVar29 = 4;
    do {
      dVar36 = *(double *)(local_2b8 + lVar29 * 8 + 8);
      uVar53 = *(undefined8 *)(local_298 + lVar29 * 8);
      uVar3 = *(undefined8 *)(local_298 + lVar29 * 8 + 8);
      local_238[lVar29] = *(double *)(local_2b8 + lVar29 * 8);
      local_238[lVar29 + 1] = dVar36;
      *(undefined8 *)(local_218 + lVar29 * 8) = uVar53;
      *(undefined8 *)(local_218 + lVar29 * 8 + 8) = uVar3;
      lVar29 = lVar29 + 2;
    } while (lVar29 != 8);
    local_268 = ZEXT816(0);
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    local_298 = ZEXT816(0);
    lVar29 = 0;
    puVar20 = local_298;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar31 = 0;
      do {
        uVar53 = 0x3ff0000000000000;
        if (lVar29 * 0x10 != lVar31) {
          uVar53 = 0;
        }
        *(undefined8 *)(puVar20 + lVar31) = uVar53;
        lVar31 = lVar31 + 0x10;
      } while (lVar31 != 0x40);
      lVar29 = 1;
      puVar20 = local_298 + 8;
      bVar52 = false;
    } while (bVar30);
    lVar29 = 0;
    do {
      uVar10 = *(undefined4 *)(local_2f8 + lVar29);
      uVar11 = *(undefined4 *)(local_2f8 + lVar29 + 4);
      uVar9 = *(undefined4 *)(local_2f8 + lVar29 + 0xc);
      uVar5 = *(undefined4 *)(local_2d8 + lVar29);
      uVar6 = *(undefined4 *)(local_2d8 + lVar29 + 4);
      uVar7 = *(undefined4 *)(local_2d8 + lVar29 + 8);
      uVar8 = *(undefined4 *)(local_2d8 + lVar29 + 0xc);
      lVar31 = lVar29 * 2;
      *(undefined4 *)(local_288 + lVar31) = *(undefined4 *)(local_2f8 + lVar29 + 8);
      *(undefined4 *)(local_288 + lVar31 + 4) = uVar9;
      *(undefined4 *)(local_288 + lVar31 + 8) = uVar7;
      *(undefined4 *)(local_278 + lVar31 + -4) = uVar8;
      lVar31 = lVar29 * 2;
      *(undefined4 *)(local_298 + lVar31) = uVar10;
      *(undefined4 *)(local_298 + lVar31 + 4) = uVar11;
      *(undefined4 *)(local_298 + lVar31 + 8) = uVar5;
      *(undefined4 *)(local_288 + lVar31 + -4) = uVar6;
      lVar29 = lVar29 + 0x10;
    } while (lVar29 != 0x20);
    puVar20 = local_298;
    puVar21 = local_88;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar29 = 0;
      do {
        *(undefined8 *)(puVar21 + lVar29) = *(undefined8 *)(puVar20 + lVar29);
        lVar29 = lVar29 + 0x10;
      } while (lVar29 != 0x40);
      puVar20 = local_298 + 8;
      puVar21 = local_88 + 8;
      bVar52 = false;
    } while (bVar30);
    puVar20 = local_298;
    apuStack_318[3] = (undefined1 *)0x93ae9c;
    tcu::operator*((Matrix<double,_4,_2> *)local_218,(Matrix<double,_2,_4> *)local_88);
    puVar21 = local_188;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar21 + lVar31) = *(undefined8 *)(puVar20 + lVar31);
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x80);
      lVar29 = lVar29 + 1;
      puVar21 = puVar21 + 8;
      puVar20 = puVar20 + 8;
    } while (lVar29 != 4);
    lVar29 = 0;
    do {
      uVar53 = *(undefined8 *)(local_188 + lVar29 + 8);
      uVar3 = *(undefined8 *)(local_178 + lVar29);
      uVar4 = *(undefined8 *)(local_178 + lVar29 + 8);
      *(undefined8 *)(local_298 + lVar29) = *(undefined8 *)(local_188 + lVar29);
      *(undefined8 *)(local_298 + lVar29 + 8) = uVar53;
      *(undefined8 *)(local_288 + lVar29) = uVar3;
      *(undefined8 *)(local_288 + lVar29 + 8) = uVar4;
      lVar29 = lVar29 + 0x20;
    } while (lVar29 != 0x80);
    goto LAB_0093c145;
  case VARIABLE_TYPE_DMAT3:
    pdVar19 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar23 = (double *)local_188;
    local_158 = ZEXT816(0);
    local_168 = ZEXT816(0);
    _local_178 = ZEXT816(0);
    local_188 = ZEXT816(0);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_148._0_8_;
    local_148 = auVar12 << 0x40;
    lVar29 = 0;
    do {
      lVar31 = 0;
      pdVar17 = pdVar23;
      do {
        *pdVar17 = pdVar19[lVar31];
        lVar31 = lVar31 + 1;
        pdVar17 = pdVar17 + 3;
      } while (lVar31 != 3);
      lVar29 = lVar29 + 1;
      pdVar23 = pdVar23 + 1;
      pdVar19 = pdVar19 + 3;
    } while (lVar29 != 3);
    pdVar19 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar23 = (double *)local_298;
    local_268 = ZEXT816(0);
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    local_298 = ZEXT816(0);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_258._0_8_;
    local_258 = auVar13 << 0x40;
    lVar29 = 0;
    do {
      lVar31 = 0;
      pdVar17 = pdVar23;
      do {
        *pdVar17 = pdVar19[lVar31];
        lVar31 = lVar31 + 1;
        pdVar17 = pdVar17 + 3;
      } while (lVar31 != 3);
      lVar29 = lVar29 + 1;
      pdVar23 = pdVar23 + 1;
      pdVar19 = pdVar19 + 3;
    } while (lVar29 != 3);
    puVar20 = local_108;
    local_d8[0] = 0;
    local_d8[1] = 0;
    local_e8 = ZEXT816(0);
    local_f8 = ZEXT816(0);
    _local_108 = ZEXT816(0);
    local_d8[2] = 0;
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      auVar40 = _DAT_019f34d0;
      do {
        bVar52 = SUB164(auVar40 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar40 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar32) = uVar53;
        }
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 + -0x18 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar32 + 0x18) = uVar53;
        }
        lVar51 = auVar40._8_8_;
        auVar40._0_8_ = auVar40._0_8_ + 2;
        auVar40._8_8_ = lVar51 + 2;
        lVar32 = lVar32 + 0x30;
      } while (lVar32 != 0x60);
      lVar31 = lVar31 + 1;
      lVar29 = lVar29 + 0x18;
      puVar20 = puVar20 + 8;
    } while (lVar31 != 3);
    puVar20 = local_218;
    local_1e8 = (undefined1  [16])0x0;
    local_1f8 = (undefined1  [16])0x0;
    local_208 = (undefined1  [16])0x0;
    local_218 = (undefined1  [16])0x0;
    local_1d8 = 0.0;
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      auVar41 = _DAT_019f34d0;
      do {
        bVar52 = SUB164(auVar41 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar41 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar32) = uVar53;
        }
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 + -0x18 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar32 + 0x18) = uVar53;
        }
        lVar51 = auVar41._8_8_;
        auVar41._0_8_ = auVar41._0_8_ + 2;
        auVar41._8_8_ = lVar51 + 2;
        lVar32 = lVar32 + 0x30;
      } while (lVar32 != 0x60);
      lVar31 = lVar31 + 1;
      lVar29 = lVar29 + 0x18;
      puVar20 = puVar20 + 8;
    } while (lVar31 != 3);
    puVar20 = local_218;
    puVar24 = (undefined8 *)local_188;
    lVar29 = 0;
    do {
      lVar31 = 0;
      puVar16 = puVar24;
      do {
        *(undefined8 *)(puVar20 + lVar31 * 8) = *puVar16;
        lVar31 = lVar31 + 1;
        puVar16 = puVar16 + 3;
      } while (lVar31 != 3);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 0x18;
      puVar24 = puVar24 + 1;
    } while (lVar29 != 3);
    puVar20 = local_188;
    puVar21 = local_218;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31) = *(undefined8 *)(puVar21 + lVar31);
        lVar31 = lVar31 + 0x18;
      } while (lVar31 != 0x48);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 8;
      puVar21 = puVar21 + 8;
    } while (lVar29 != 3);
    puVar20 = local_218;
    local_1e8 = (undefined1  [16])0x0;
    local_1f8 = (undefined1  [16])0x0;
    local_208 = (undefined1  [16])0x0;
    local_218 = (undefined1  [16])0x0;
    local_1d8 = 0.0;
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      auVar42 = _DAT_019f34d0;
      do {
        bVar52 = SUB164(auVar42 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar42 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar32) = uVar53;
        }
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 + -0x18 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar32 + 0x18) = uVar53;
        }
        lVar51 = auVar42._8_8_;
        auVar42._0_8_ = auVar42._0_8_ + 2;
        auVar42._8_8_ = lVar51 + 2;
        lVar32 = lVar32 + 0x30;
      } while (lVar32 != 0x60);
      lVar31 = lVar31 + 1;
      lVar29 = lVar29 + 0x18;
      puVar20 = puVar20 + 8;
    } while (lVar31 != 3);
    puVar20 = local_218;
    puVar24 = (undefined8 *)local_298;
    lVar29 = 0;
    do {
      lVar31 = 0;
      puVar16 = puVar24;
      do {
        *(undefined8 *)(puVar20 + lVar31 * 8) = *puVar16;
        lVar31 = lVar31 + 1;
        puVar16 = puVar16 + 3;
      } while (lVar31 != 3);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 0x18;
      puVar24 = puVar24 + 1;
    } while (lVar29 != 3);
    puVar20 = local_298;
    puVar21 = local_218;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31) = *(undefined8 *)(puVar21 + lVar31);
        lVar31 = lVar31 + 0x18;
      } while (lVar31 != 0x48);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 8;
      puVar21 = puVar21 + 8;
    } while (lVar29 != 3);
    pdVar23 = (double *)local_218;
    apuStack_318[3] = (undefined1 *)0x93b313;
    tcu::operator*((Matrix<double,_3,_3> *)pdVar23,(Matrix<double,_3,_3> *)local_188,
                   (Matrix<double,_3,_3> *)local_298);
    puVar20 = local_108;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31) = *(undefined8 *)((long)pdVar23 + lVar31);
        lVar31 = lVar31 + 0x18;
      } while (lVar31 != 0x48);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 8;
      pdVar23 = pdVar23 + 1;
    } while (lVar29 != 3);
    puVar20 = local_218;
    puVar21 = local_108;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31) = *(undefined8 *)(puVar21 + lVar31);
        lVar31 = lVar31 + 8;
      } while (lVar31 != 0x18);
      lVar29 = lVar29 + 1;
      puVar21 = puVar21 + 0x18;
      puVar20 = puVar20 + 0x18;
    } while (lVar29 != 3);
    pdVar23 = (double *)local_218;
    break;
  case VARIABLE_TYPE_DMAT3X2:
    puVar20 = local_298 + 8;
    pdVar19 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_168 = ZEXT816(0);
    _local_178 = ZEXT816(0);
    local_188 = ZEXT816(0);
    lVar29 = 0;
    do {
      *(undefined8 *)(local_188 + lVar29) = *(undefined8 *)((long)pdVar19 + lVar29 * 2);
      *(undefined8 *)(local_178 + lVar29 + 8) = *(undefined8 *)((long)pdVar19 + lVar29 * 2 + 8);
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x18);
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    local_298 = ZEXT816(0);
    lVar29 = 0;
    puVar21 = local_298;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar31 = 0;
      auVar38 = _DAT_019f34d0;
      do {
        bVar52 = SUB164(auVar38 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar38 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 * 0x10 != lVar31) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar21 + lVar31) = uVar53;
        }
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 * 0x10 + -0x10 != lVar31) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar21 + lVar31 + 0x10) = uVar53;
        }
        lVar32 = auVar38._8_8_;
        auVar38._0_8_ = auVar38._0_8_ + 2;
        auVar38._8_8_ = lVar32 + 2;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x40);
      lVar29 = 1;
      puVar21 = puVar20;
      bVar52 = false;
    } while (bVar30);
    pdVar19 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_e8 = (undefined1  [16])0x0;
    local_f8 = (undefined1  [16])0x0;
    _local_108 = (undefined1  [16])0x0;
    lVar29 = 0;
    puVar21 = local_108;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar21 + lVar31 * 2) = *(undefined8 *)((long)pdVar19 + lVar31 + lVar29);
        lVar31 = lVar31 + 8;
      } while (lVar31 != 0x18);
      lVar29 = 0x18;
      puVar21 = local_108 + 8;
      bVar52 = false;
    } while (bVar30);
    local_1f8 = (undefined1  [16])0x0;
    local_208 = (undefined1  [16])0x0;
    local_218 = (undefined1  [16])0x0;
    lVar29 = 0;
    do {
      uVar53 = 0x3ff0000000000000;
      if (lVar29 != 0) {
        uVar53 = 0;
      }
      *(undefined8 *)(local_218 + lVar29 * 8) = uVar53;
      uVar53 = 0x3ff0000000000000;
      if (lVar29 != 1) {
        uVar53 = 0;
      }
      *(undefined8 *)(local_208 + lVar29 * 8 + 8) = uVar53;
      lVar29 = lVar29 + 1;
    } while (lVar29 != 3);
    lVar29 = 0;
    local_88 = ZEXT816(0x3ff0000000000000);
    local_198 = 0.0;
    dStack_190 = 1.0;
    local_2d8 = (undefined1  [16])0x0;
    local_2f8._16_8_ = 0.0;
    local_2f8._24_8_ = 0.0;
    local_2f8._0_8_ = 0.0;
    local_2f8._8_8_ = 0.0;
    puVar21 = local_2f8;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar31 = 0;
      auVar39 = _DAT_019f34d0;
      do {
        bVar52 = SUB164(auVar39 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar39 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 * 0x10 != lVar31) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar21 + lVar31) = uVar53;
        }
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 * 0x10 + -0x10 != lVar31) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar21 + lVar31 + 0x10) = uVar53;
        }
        lVar32 = auVar39._8_8_;
        auVar39._0_8_ = auVar39._0_8_ + 2;
        auVar39._8_8_ = lVar32 + 2;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x40);
      lVar29 = 1;
      puVar21 = local_2f8 + 8;
      bVar52 = false;
    } while (bVar30);
    lVar29 = 0;
    do {
      uVar53 = *(undefined8 *)(local_178 + lVar29 + 8);
      *(undefined8 *)(local_2f8 + lVar29 * 2) = *(undefined8 *)(local_188 + lVar29);
      *(undefined8 *)(local_2f8 + lVar29 * 2 + 8) = uVar53;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x18);
    puVar21 = local_2f8;
    puVar22 = local_298;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar29 = 0;
      do {
        *(undefined8 *)(puVar22 + lVar29) = *(undefined8 *)(puVar21 + lVar29);
        lVar29 = lVar29 + 0x10;
      } while (lVar29 != 0x30);
      puVar21 = local_2f8 + 8;
      puVar22 = puVar20;
      bVar52 = false;
    } while (bVar30);
    local_2d8 = (undefined1  [16])0x0;
    local_2f8._16_8_ = 0.0;
    local_2f8._24_8_ = 0.0;
    local_2f8._0_8_ = 0.0;
    local_2f8._8_8_ = 0.0;
    lVar29 = 0;
    do {
      uVar53 = 0x3ff0000000000000;
      if (lVar29 != 0) {
        uVar53 = 0;
      }
      *(undefined8 *)(local_2f8 + lVar29 * 8) = uVar53;
      uVar53 = 0x3ff0000000000000;
      if (lVar29 != 1) {
        uVar53 = 0;
      }
      *(undefined8 *)(local_2d8 + lVar29 * 8 + -8) = uVar53;
      lVar29 = lVar29 + 1;
    } while (lVar29 != 3);
    puVar21 = local_2f8;
    puVar22 = local_108;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar29 = 0;
      do {
        *(undefined8 *)(puVar21 + lVar29) = *(undefined8 *)(puVar22 + lVar29 * 2);
        lVar29 = lVar29 + 8;
      } while (lVar29 != 0x18);
      puVar21 = local_2f8 + 0x18;
      puVar22 = local_108 + 8;
      bVar52 = false;
    } while (bVar30);
    lVar29 = 0;
    do {
      uVar53 = *(undefined8 *)(local_2d8 + lVar29 * 8 + -8);
      *(undefined8 *)(local_218 + lVar29 * 8) = *(undefined8 *)(local_2f8 + lVar29 * 8);
      *(undefined8 *)(local_208 + lVar29 * 8 + 8) = uVar53;
      lVar29 = lVar29 + 1;
    } while (lVar29 != 3);
    local_2f8._0_8_ = 1.0;
    local_2f8._8_8_ = 0.0;
    local_2f8._16_8_ = 0.0;
    local_2f8._24_8_ = 1.0;
    puVar21 = local_2f8;
    puVar22 = local_298;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar29 = 0;
      puVar26 = local_218;
      bVar52 = true;
      do {
        bVar33 = bVar52;
        dVar36 = 0.0;
        lVar31 = 0;
        do {
          dVar36 = dVar36 + *(double *)(puVar22 + lVar31 * 2) * *(double *)(puVar26 + lVar31);
          lVar31 = lVar31 + 8;
        } while (lVar31 != 0x18);
        *(double *)(puVar21 + lVar29 * 0x10) = dVar36;
        lVar29 = 1;
        puVar26 = local_208 + 8;
        bVar52 = false;
      } while (bVar33);
      puVar21 = local_2f8 + 8;
      puVar22 = puVar20;
      bVar52 = false;
    } while (bVar30);
    local_88._8_8_ = local_2f8._8_8_;
    local_88._0_8_ = local_2f8._0_8_;
    local_198 = (double)local_2f8._16_8_;
    dStack_190 = (double)local_2f8._24_8_;
    pdVar23 = (double *)local_88;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      dVar36 = pdVar23[1];
      *pdVar17 = *pdVar23;
      pdVar17[1] = dVar36;
      pdVar17 = pdVar17 + 2;
      pdVar23 = &local_198;
      bVar52 = false;
      local_188._0_8_ = local_2f8._0_8_;
      local_188._8_8_ = local_2f8._8_8_;
      local_178 = (undefined1  [8])local_2f8._16_8_;
      dStack_170 = (double)local_2f8._24_8_;
    } while (bVar30);
    goto LAB_0093b75f;
  case VARIABLE_TYPE_DMAT3X4:
    pdVar19 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar23 = (double *)local_108;
    local_d8[4] = 0;
    local_d8[5] = 0;
    local_d8[2] = 0;
    local_d8[3] = 0;
    local_d8[0] = 0;
    local_d8[1] = 0;
    local_e8 = ZEXT816(0);
    local_f8 = ZEXT816(0);
    _local_108 = ZEXT816(0);
    lVar29 = 0;
    do {
      lVar31 = 0;
      pdVar17 = pdVar23;
      do {
        *pdVar17 = pdVar19[lVar31];
        lVar31 = lVar31 + 1;
        pdVar17 = pdVar17 + 3;
      } while (lVar31 != 4);
      lVar29 = lVar29 + 1;
      pdVar23 = pdVar23 + 1;
      pdVar19 = pdVar19 + 4;
    } while (lVar29 != 3);
    puVar20 = local_1f8;
    local_1c8 = 0.0;
    dStack_1c0 = 0.0;
    local_1d8 = 0.0;
    dStack_1d0 = 0.0;
    local_1e8 = ZEXT816(0);
    local_1f8 = ZEXT816(0);
    local_208 = ZEXT816(0);
    local_218 = ZEXT816(0);
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      auVar46 = _DAT_019f34d0;
      do {
        bVar52 = SUB164(auVar46 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar46 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar32 + -0x20) = uVar53;
        }
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 + -0x20 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar32) = uVar53;
        }
        lVar51 = auVar46._8_8_;
        auVar46._0_8_ = auVar46._0_8_ + 2;
        auVar46._8_8_ = lVar51 + 2;
        lVar32 = lVar32 + 0x40;
      } while (lVar32 != 0x80);
      lVar31 = lVar31 + 1;
      lVar29 = lVar29 + 0x20;
      puVar20 = puVar20 + 8;
    } while (lVar31 != 4);
    pdVar19 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_2a8 = (undefined1  [16])0x0;
    local_2b8 = (undefined1  [16])0x0;
    local_2c8 = (undefined1  [16])0x0;
    local_2d8 = (undefined1  [16])0x0;
    local_2f8._16_8_ = 0.0;
    local_2f8._24_8_ = 0.0;
    local_2f8._0_8_ = 0.0;
    local_2f8._8_8_ = 0.0;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar26 + lVar31 * 4) = *(undefined8 *)((long)pdVar19 + lVar31);
        lVar31 = lVar31 + 8;
      } while (lVar31 != 0x18);
      lVar29 = lVar29 + 1;
      puVar26 = puVar26 + 8;
      pdVar19 = pdVar19 + 3;
    } while (lVar29 != 4);
    puVar20 = local_88;
    local_38 = (undefined1  [16])0x0;
    local_48 = (undefined1  [16])0x0;
    local_58.m_data[0] = 0.0;
    local_58.m_data[1] = 0.0;
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    local_78.m_data[0] = 0.0;
    local_78.m_data[1] = 0.0;
    local_88._0_8_ = 0.0;
    local_88._8_8_ = 0.0;
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      do {
        uVar53 = 0x3ff0000000000000;
        if (lVar29 != lVar32) {
          uVar53 = 0;
        }
        *(undefined8 *)(puVar20 + lVar32) = uVar53;
        lVar32 = lVar32 + 0x18;
      } while (lVar32 != 0x60);
      lVar31 = lVar31 + 1;
      puVar20 = puVar20 + 8;
      lVar29 = lVar29 + 0x18;
    } while (lVar31 != 3);
    puVar20 = local_188;
    local_118 = (undefined1  [16])0x0;
    local_128 = (undefined1  [16])0x0;
    local_138 = (undefined1  [16])0x0;
    local_148 = (undefined1  [16])0x0;
    local_158 = (undefined1  [16])0x0;
    local_168 = (undefined1  [16])0x0;
    _local_178 = (undefined1  [16])0x0;
    local_188 = (undefined1  [16])0x0;
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      do {
        uVar53 = 0x3ff0000000000000;
        if (lVar29 != lVar32) {
          uVar53 = 0;
        }
        *(undefined8 *)(puVar20 + lVar32) = uVar53;
        lVar32 = lVar32 + 0x20;
      } while (lVar32 != 0x80);
      lVar31 = lVar31 + 1;
      puVar20 = puVar20 + 8;
      lVar29 = lVar29 + 0x20;
    } while (lVar31 != 4);
    puVar20 = local_278;
    local_248 = (undefined1  [16])0x0;
    local_258 = (undefined1  [16])0x0;
    local_268 = (undefined1  [16])0x0;
    local_278 = (undefined1  [16])0x0;
    local_288 = (undefined1  [16])0x0;
    local_298 = (undefined1  [16])0x0;
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      auVar47 = _DAT_019f34d0;
      do {
        bVar52 = SUB164(auVar47 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar47 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar32 + -0x20) = uVar53;
        }
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 + -0x20 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar32) = uVar53;
        }
        lVar51 = auVar47._8_8_;
        auVar47._0_8_ = auVar47._0_8_ + 2;
        auVar47._8_8_ = lVar51 + 2;
        lVar32 = lVar32 + 0x40;
      } while (lVar32 != 0x80);
      lVar31 = lVar31 + 1;
      lVar29 = lVar29 + 0x20;
      puVar20 = puVar20 + 8;
    } while (lVar31 != 4);
    lVar29 = 0;
    do {
      uVar53 = *(undefined8 *)((long)local_d8 + lVar29);
      uVar3 = *(undefined8 *)(local_f8 + lVar29 + 8);
      uVar4 = *(undefined8 *)((long)local_d8 + lVar29 + 0x18);
      *(undefined8 *)(local_298 + lVar29 * 4) = *(undefined8 *)(local_108 + lVar29);
      *(undefined8 *)(local_298 + lVar29 * 4 + 8) = uVar3;
      *(undefined8 *)(local_288 + lVar29 * 4) = uVar53;
      *(undefined8 *)(local_288 + lVar29 * 4 + 8) = uVar4;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x18);
    puVar21 = local_218;
    puVar20 = local_298;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar21 + lVar31) = *(undefined8 *)(puVar20 + lVar31);
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x60);
      lVar29 = lVar29 + 1;
      puVar21 = puVar21 + 8;
      puVar20 = puVar20 + 8;
    } while (lVar29 != 4);
    puVar20 = local_298;
    local_248 = (undefined1  [16])0x0;
    local_258 = (undefined1  [16])0x0;
    local_268 = (undefined1  [16])0x0;
    local_278 = (undefined1  [16])0x0;
    local_288 = (undefined1  [16])0x0;
    local_298 = (undefined1  [16])0x0;
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      do {
        uVar53 = 0x3ff0000000000000;
        if (lVar29 != lVar32) {
          uVar53 = 0;
        }
        *(undefined8 *)(puVar20 + lVar32) = uVar53;
        lVar32 = lVar32 + 0x18;
      } while (lVar32 != 0x60);
      lVar31 = lVar31 + 1;
      puVar20 = puVar20 + 8;
      lVar29 = lVar29 + 0x18;
    } while (lVar31 != 3);
    puVar20 = local_298;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31) = *(undefined8 *)(puVar25 + lVar31 * 4);
        lVar31 = lVar31 + 8;
      } while (lVar31 != 0x18);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 0x18;
      puVar25 = puVar25 + 8;
    } while (lVar29 != 4);
    puVar21 = local_88;
    puVar20 = local_298;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar21 + lVar31) = *(undefined8 *)(puVar20 + lVar31);
        lVar31 = lVar31 + 0x18;
      } while (lVar31 != 0x60);
      lVar29 = lVar29 + 1;
      puVar21 = puVar21 + 8;
      puVar20 = puVar20 + 8;
    } while (lVar29 != 3);
    pdVar23 = (double *)local_298;
    apuStack_318[3] = (undefined1 *)0x93c0e4;
    tcu::operator*((Matrix<double,_4,_4> *)pdVar23,(Matrix<double,_4,_3> *)local_218,
                   (Matrix<double,_3,_4> *)local_88);
    puVar20 = local_188;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31) = *(undefined8 *)((long)pdVar23 + lVar31);
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x80);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 8;
      pdVar23 = pdVar23 + 1;
    } while (lVar29 != 4);
    lVar29 = 0;
    do {
      uVar53 = *(undefined8 *)(local_188 + lVar29 + 8);
      uVar3 = *(undefined8 *)(local_178 + lVar29);
      uVar4 = *(undefined8 *)(local_178 + lVar29 + 8);
      *(undefined8 *)(local_298 + lVar29) = *(undefined8 *)(local_188 + lVar29);
      *(undefined8 *)(local_298 + lVar29 + 8) = uVar53;
      *(undefined8 *)(local_288 + lVar29) = uVar3;
      *(undefined8 *)(local_288 + lVar29 + 8) = uVar4;
      lVar29 = lVar29 + 0x20;
    } while (lVar29 != 0x80);
LAB_0093c145:
    pdVar23 = (double *)local_298;
LAB_0093c4a0:
    lVar29 = 0x10;
    goto code_r0x0093c9cc;
  case VARIABLE_TYPE_DMAT4:
    pdVar19 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar20 = local_188;
    local_118 = ZEXT816(0);
    local_128 = ZEXT816(0);
    local_138 = ZEXT816(0);
    local_148 = ZEXT816(0);
    local_158 = ZEXT816(0);
    local_168 = ZEXT816(0);
    _local_178 = ZEXT816(0);
    local_188 = ZEXT816(0);
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31 * 4) = *(undefined8 *)((long)pdVar19 + lVar31);
        lVar31 = lVar31 + 8;
      } while (lVar31 != 0x20);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 8;
      pdVar19 = pdVar19 + 4;
    } while (lVar29 != 4);
    pdVar19 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar20 = local_298;
    local_238[2] = 0.0;
    local_238[3] = 0.0;
    local_238[0] = 0.0;
    local_238[1] = 0.0;
    local_248 = ZEXT816(0);
    local_258 = ZEXT816(0);
    local_268 = ZEXT816(0);
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    local_298 = ZEXT816(0);
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31 * 4) = *(undefined8 *)((long)pdVar19 + lVar31);
        lVar31 = lVar31 + 8;
      } while (lVar31 != 0x20);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 8;
      pdVar19 = pdVar19 + 4;
    } while (lVar29 != 4);
    puVar20 = local_108;
    local_d8[8] = 0;
    local_d8[9] = 0;
    local_d8[6] = 0;
    local_d8[7] = 0;
    local_d8[4] = 0;
    local_d8[5] = 0;
    local_d8[2] = 0;
    local_d8[3] = 0;
    local_d8[0] = 0;
    local_d8[1] = 0;
    local_e8 = ZEXT816(0);
    local_f8 = ZEXT816(0);
    _local_108 = ZEXT816(0);
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      do {
        uVar53 = 0x3ff0000000000000;
        if (lVar29 != lVar32) {
          uVar53 = 0;
        }
        *(undefined8 *)(puVar20 + lVar32) = uVar53;
        lVar32 = lVar32 + 0x20;
      } while (lVar32 != 0x80);
      lVar31 = lVar31 + 1;
      puVar20 = puVar20 + 8;
      lVar29 = lVar29 + 0x20;
    } while (lVar31 != 4);
    puVar20 = local_218;
    local_1a8 = 0;
    uStack_1a0 = 0;
    local_1b8 = 0;
    uStack_1b0 = 0;
    local_1c8 = 0.0;
    dStack_1c0 = 0.0;
    local_1d8 = 0.0;
    dStack_1d0 = 0.0;
    local_1e8 = ZEXT816(0);
    local_1f8 = ZEXT816(0);
    local_208 = ZEXT816(0);
    local_218 = ZEXT816(0);
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      do {
        uVar53 = 0x3ff0000000000000;
        if (lVar29 != lVar32) {
          uVar53 = 0;
        }
        *(undefined8 *)(puVar20 + lVar32) = uVar53;
        lVar32 = lVar32 + 0x20;
      } while (lVar32 != 0x80);
      lVar31 = lVar31 + 1;
      puVar20 = puVar20 + 8;
      lVar29 = lVar29 + 0x20;
    } while (lVar31 != 4);
    lVar29 = 0;
    do {
      uVar53 = *(undefined8 *)(local_148 + lVar29);
      uVar3 = *(undefined8 *)(local_168 + lVar29);
      uVar4 = *(undefined8 *)(local_128 + lVar29);
      *(undefined8 *)(local_218 + lVar29 * 4) = *(undefined8 *)(local_188 + lVar29);
      *(undefined8 *)(local_218 + lVar29 * 4 + 8) = uVar3;
      *(undefined8 *)(local_208 + lVar29 * 4) = uVar53;
      *(undefined8 *)(local_208 + lVar29 * 4 + 8) = uVar4;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x20);
    puVar20 = local_188;
    puVar21 = local_218;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31) = *(undefined8 *)(puVar21 + lVar31);
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x80);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 8;
      puVar21 = puVar21 + 8;
    } while (lVar29 != 4);
    puVar20 = local_218;
    local_1a8 = 0;
    uStack_1a0 = 0;
    local_1b8 = 0;
    uStack_1b0 = 0;
    local_1c8 = 0.0;
    dStack_1c0 = 0.0;
    local_1d8 = 0.0;
    dStack_1d0 = 0.0;
    local_1e8 = ZEXT816(0);
    local_1f8 = ZEXT816(0);
    local_208 = ZEXT816(0);
    local_218 = ZEXT816(0);
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      do {
        uVar53 = 0x3ff0000000000000;
        if (lVar29 != lVar32) {
          uVar53 = 0;
        }
        *(undefined8 *)(puVar20 + lVar32) = uVar53;
        lVar32 = lVar32 + 0x20;
      } while (lVar32 != 0x80);
      lVar31 = lVar31 + 1;
      puVar20 = puVar20 + 8;
      lVar29 = lVar29 + 0x20;
    } while (lVar31 != 4);
    lVar29 = 0;
    do {
      uVar53 = *(undefined8 *)(local_258 + lVar29);
      uVar3 = *(undefined8 *)(local_278 + lVar29);
      uVar4 = *(undefined8 *)((long)local_238 + lVar29);
      *(undefined8 *)(local_218 + lVar29 * 4) = *(undefined8 *)(local_298 + lVar29);
      *(undefined8 *)(local_218 + lVar29 * 4 + 8) = uVar3;
      *(undefined8 *)(local_208 + lVar29 * 4) = uVar53;
      *(undefined8 *)(local_208 + lVar29 * 4 + 8) = uVar4;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x20);
    puVar20 = local_298;
    puVar21 = local_218;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31) = *(undefined8 *)(puVar21 + lVar31);
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x80);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 8;
      puVar21 = puVar21 + 8;
    } while (lVar29 != 4);
    pdVar23 = (double *)local_218;
    apuStack_318[3] = (undefined1 *)0x93c435;
    tcu::operator*((Matrix<double,_4,_4> *)pdVar23,(Matrix<double,_4,_4> *)local_188,
                   (Matrix<double,_4,_4> *)local_298);
    puVar20 = local_108;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31) = *(undefined8 *)((long)pdVar23 + lVar31);
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x80);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 8;
      pdVar23 = pdVar23 + 1;
    } while (lVar29 != 4);
    lVar29 = 0;
    do {
      uVar53 = *(undefined8 *)(local_108 + lVar29 + 8);
      uVar3 = *(undefined8 *)(local_f8 + lVar29);
      uVar4 = *(undefined8 *)(local_f8 + lVar29 + 8);
      *(undefined8 *)(local_218 + lVar29) = *(undefined8 *)(local_108 + lVar29);
      *(undefined8 *)(local_218 + lVar29 + 8) = uVar53;
      *(undefined8 *)(local_208 + lVar29) = uVar3;
      *(undefined8 *)(local_208 + lVar29 + 8) = uVar4;
      lVar29 = lVar29 + 0x20;
    } while (lVar29 != 0x80);
    pdVar23 = (double *)local_218;
    goto LAB_0093c4a0;
  case VARIABLE_TYPE_DMAT4X2:
    puVar20 = local_298 + 8;
    pdVar19 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_158 = ZEXT816(0);
    local_168 = ZEXT816(0);
    _local_178 = ZEXT816(0);
    local_188 = ZEXT816(0);
    lVar29 = 0;
    do {
      puVar1 = (undefined4 *)((long)pdVar19 + lVar29 * 2);
      uVar11 = puVar1[1];
      uVar9 = puVar1[2];
      uVar10 = puVar1[3];
      puVar2 = (undefined4 *)((long)pdVar19 + lVar29 * 2 + 0x10);
      uVar5 = *puVar2;
      uVar6 = puVar2[1];
      uVar7 = puVar2[2];
      uVar8 = puVar2[3];
      *(undefined4 *)(local_188 + lVar29) = *puVar1;
      *(undefined4 *)(local_188 + lVar29 + 4) = uVar11;
      *(undefined4 *)(local_188 + lVar29 + 8) = uVar5;
      *(undefined4 *)(local_188 + lVar29 + 0xc) = uVar6;
      *(undefined4 *)(local_168 + lVar29) = uVar9;
      *(undefined4 *)(local_168 + lVar29 + 4) = uVar10;
      *(undefined4 *)(local_168 + lVar29 + 8) = uVar7;
      *(undefined4 *)(local_168 + lVar29 + 0xc) = uVar8;
      lVar29 = lVar29 + 0x10;
    } while (lVar29 != 0x20);
    local_268 = ZEXT816(0);
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    local_298 = ZEXT816(0);
    lVar29 = 0;
    puVar21 = local_298;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar31 = 0;
      do {
        uVar53 = 0x3ff0000000000000;
        if (lVar29 * 0x10 != lVar31) {
          uVar53 = 0;
        }
        *(undefined8 *)(puVar21 + lVar31) = uVar53;
        lVar31 = lVar31 + 0x10;
      } while (lVar31 != 0x40);
      lVar29 = 1;
      puVar21 = puVar20;
      bVar52 = false;
    } while (bVar30);
    pdVar19 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_d8[0] = 0;
    local_d8[1] = 0;
    local_e8 = ZEXT816(0);
    local_f8 = ZEXT816(0);
    _local_108 = ZEXT816(0);
    lVar29 = 0;
    puVar24 = (undefined8 *)local_108;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar31 = 0;
      do {
        *(undefined8 *)((long)puVar24 + lVar31 * 2) =
             *(undefined8 *)((long)pdVar19 + lVar31 + lVar29);
        lVar31 = lVar31 + 8;
      } while (lVar31 != 0x20);
      lVar29 = 0x20;
      puVar24 = (undefined8 *)(local_108 + 8);
      bVar52 = false;
    } while (bVar30);
    local_218 = ZEXT816(0x3ff0000000000000);
    local_1f8._0_12_ = ZEXT812(0);
    local_1f8._12_4_ = 0x3ff00000;
    local_208 = ZEXT816(0);
    local_1e8 = ZEXT816(0);
    lVar29 = 0;
    local_88 = ZEXT816(0x3ff0000000000000);
    local_198 = 0.0;
    dStack_190 = 1.0;
    local_2c8 = ZEXT816(0);
    local_2d8 = ZEXT816(0);
    local_2f8._16_8_ = 0.0;
    local_2f8._24_8_ = 0.0;
    local_2f8._0_8_ = 0.0;
    local_2f8._8_8_ = 0.0;
    puVar21 = local_2f8;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar31 = 0;
      do {
        uVar37 = 0x3ff00000;
        if (lVar29 * 0x10 != lVar31) {
          uVar37 = 0;
        }
        *(ulong *)(puVar21 + lVar31) = (ulong)uVar37 << 0x20;
        lVar31 = lVar31 + 0x10;
      } while (lVar31 != 0x40);
      lVar29 = 1;
      puVar21 = local_2f8 + 8;
      bVar52 = false;
    } while (bVar30);
    lVar29 = 0;
    do {
      uVar53 = *(undefined8 *)(local_188 + lVar29);
      uVar3 = *(undefined8 *)(local_168 + lVar29);
      uVar4 = *(undefined8 *)(local_168 + lVar29 + 8);
      *(undefined8 *)(local_2f8 + lVar29 * 2 + 0x10) = *(undefined8 *)(local_188 + lVar29 + 8);
      *(undefined8 *)(local_2d8 + lVar29 * 2 + -8) = uVar4;
      *(undefined8 *)(local_2f8 + lVar29 * 2) = uVar53;
      *(undefined8 *)(local_2f8 + lVar29 * 2 + 8) = uVar3;
      lVar29 = lVar29 + 0x10;
    } while (lVar29 != 0x20);
    puVar21 = local_2f8;
    puVar22 = local_298;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar29 = 0;
      do {
        *(undefined8 *)(puVar22 + lVar29) = *(undefined8 *)(puVar21 + lVar29);
        lVar29 = lVar29 + 0x10;
      } while (lVar29 != 0x40);
      puVar21 = local_2f8 + 8;
      puVar22 = puVar20;
      bVar52 = false;
    } while (bVar30);
    local_2f8._0_8_ = 1.0;
    local_2f8._8_8_ = 0.0;
    local_2d8 = ZEXT816(0x3ff0000000000000) << 0x40;
    local_2f8._16_8_ = 0.0;
    local_2f8._24_8_ = 0.0;
    local_2c8 = ZEXT816(0);
    puVar24 = (undefined8 *)local_2f8;
    puVar16 = (undefined8 *)local_108;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      uVar53 = puVar16[2];
      *puVar24 = *puVar16;
      puVar24[1] = uVar53;
      uVar53 = puVar16[6];
      puVar24[2] = puVar16[4];
      puVar24[3] = uVar53;
      puVar24 = (undefined8 *)local_2d8;
      puVar16 = (undefined8 *)(local_108 + 8);
      bVar52 = false;
    } while (bVar30);
    lVar29 = 4;
    do {
      puVar21 = apuStack_318[lVar29 + 1];
      uVar53 = *(undefined8 *)(local_2f8 + lVar29 * 8);
      uVar3 = *(undefined8 *)(local_2f8 + lVar29 * 8 + 8);
      local_238[lVar29] = (double)apuStack_318[lVar29];
      local_238[lVar29 + 1] = (double)puVar21;
      *(undefined8 *)(local_218 + lVar29 * 8) = uVar53;
      *(undefined8 *)(local_218 + lVar29 * 8 + 8) = uVar3;
      lVar29 = lVar29 + 2;
    } while (lVar29 != 8);
    local_2f8._0_8_ = 1.0;
    local_2f8._8_8_ = 0.0;
    local_2f8._16_8_ = 0.0;
    local_2f8._24_8_ = 1.0;
    puVar21 = local_2f8;
    puVar22 = local_298;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      lVar29 = 0;
      puVar26 = local_218;
      bVar52 = true;
      do {
        bVar33 = bVar52;
        dVar36 = 0.0;
        lVar31 = 0;
        do {
          dVar36 = dVar36 + *(double *)(puVar22 + lVar31 * 2) * *(double *)(puVar26 + lVar31);
          lVar31 = lVar31 + 8;
        } while (lVar31 != 0x20);
        *(double *)(puVar21 + lVar29 * 0x10) = dVar36;
        lVar29 = 1;
        puVar26 = local_1f8;
        bVar52 = false;
      } while (bVar33);
      puVar21 = local_2f8 + 8;
      puVar22 = puVar20;
      bVar52 = false;
    } while (bVar30);
    local_88._8_8_ = local_2f8._8_8_;
    local_88._0_8_ = local_2f8._0_8_;
    local_198 = (double)local_2f8._16_8_;
    dStack_190 = (double)local_2f8._24_8_;
    pdVar23 = (double *)local_88;
    bVar52 = true;
    do {
      bVar30 = bVar52;
      dVar36 = pdVar23[1];
      *pdVar18 = *pdVar23;
      pdVar18[1] = dVar36;
      pdVar18 = pdVar18 + 2;
      pdVar23 = &local_198;
      bVar52 = false;
      local_188._0_8_ = local_2f8._0_8_;
      local_188._8_8_ = local_2f8._8_8_;
      local_178 = (undefined1  [8])local_2f8._16_8_;
      dStack_170 = (double)local_2f8._24_8_;
    } while (bVar30);
LAB_0093b75f:
    out_result_ptr[2] = (double)local_178;
    out_result_ptr[3] = dStack_170;
    *out_result_ptr = (double)local_188._0_8_;
    out_result_ptr[1] = (double)local_188._8_8_;
    return;
  case VARIABLE_TYPE_DMAT4X3:
    pdVar19 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar26 = local_188;
    local_138 = ZEXT816(0);
    local_148 = ZEXT816(0);
    local_158 = ZEXT816(0);
    local_168 = ZEXT816(0);
    _local_178 = ZEXT816(0);
    local_188 = ZEXT816(0);
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar26 + lVar31 * 4) = *(undefined8 *)((long)pdVar19 + lVar31);
        lVar31 = lVar31 + 8;
      } while (lVar31 != 0x18);
      lVar29 = lVar29 + 1;
      puVar26 = puVar26 + 8;
      pdVar19 = pdVar19 + 3;
    } while (lVar29 != 4);
    puVar26 = local_298;
    local_248 = ZEXT816(0);
    local_258 = ZEXT816(0);
    local_268 = ZEXT816(0);
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    local_298 = ZEXT816(0);
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      do {
        uVar53 = 0x3ff0000000000000;
        if (lVar29 != lVar32) {
          uVar53 = 0;
        }
        *(undefined8 *)(puVar26 + lVar32) = uVar53;
        lVar32 = lVar32 + 0x18;
      } while (lVar32 != 0x60);
      lVar31 = lVar31 + 1;
      puVar26 = puVar26 + 8;
      lVar29 = lVar29 + 0x18;
    } while (lVar31 != 3);
    pdVar19 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar17 = (double *)local_108;
    local_d8[4] = 0;
    local_d8[5] = 0;
    local_d8[2] = 0;
    local_d8[3] = 0;
    local_d8[0] = 0;
    local_d8[1] = 0;
    local_e8 = ZEXT816(0);
    local_f8 = ZEXT816(0);
    _local_108 = ZEXT816(0);
    lVar29 = 0;
    do {
      lVar31 = 0;
      pdVar18 = pdVar17;
      do {
        *pdVar18 = pdVar19[lVar31];
        lVar31 = lVar31 + 1;
        pdVar18 = pdVar18 + 3;
      } while (lVar31 != 4);
      lVar29 = lVar29 + 1;
      pdVar17 = pdVar17 + 1;
      pdVar19 = pdVar19 + 4;
    } while (lVar29 != 3);
    puVar26 = local_1f8;
    local_1c8 = 0.0;
    dStack_1c0 = 0.0;
    local_1d8 = 0.0;
    dStack_1d0 = 0.0;
    local_1e8 = ZEXT816(0);
    local_1f8 = ZEXT816(0);
    local_208 = ZEXT816(0);
    local_218 = ZEXT816(0);
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      auVar48 = _DAT_019f34d0;
      do {
        bVar52 = SUB164(auVar48 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar48 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar26 + lVar32 + -0x20) = uVar53;
        }
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 + -0x20 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar26 + lVar32) = uVar53;
        }
        lVar51 = auVar48._8_8_;
        auVar48._0_8_ = auVar48._0_8_ + 2;
        auVar48._8_8_ = lVar51 + 2;
        lVar32 = lVar32 + 0x40;
      } while (lVar32 != 0x80);
      lVar31 = lVar31 + 1;
      lVar29 = lVar29 + 0x20;
      puVar26 = puVar26 + 8;
    } while (lVar31 != 4);
    puVar26 = local_88;
    local_58.m_data[0] = 0.0;
    local_58.m_data[1] = 0.0;
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    local_78.m_data[0] = 0.0;
    local_78.m_data[1] = 0.0;
    local_88._0_8_ = 0.0;
    local_88._8_8_ = 0.0;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_48._8_8_;
    local_48 = auVar15 << 0x40;
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      auVar49 = _DAT_019f34d0;
      do {
        bVar52 = SUB164(auVar49 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar49 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar26 + lVar32) = uVar53;
        }
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 + -0x18 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar26 + lVar32 + 0x18) = uVar53;
        }
        lVar51 = auVar49._8_8_;
        auVar49._0_8_ = auVar49._0_8_ + 2;
        auVar49._8_8_ = lVar51 + 2;
        lVar32 = lVar32 + 0x30;
      } while (lVar32 != 0x60);
      lVar31 = lVar31 + 1;
      lVar29 = lVar29 + 0x18;
      puVar26 = puVar26 + 8;
    } while (lVar31 != 3);
    local_2a8 = (undefined1  [16])0x0;
    local_2b8 = (undefined1  [16])0x0;
    local_2c8 = (undefined1  [16])0x0;
    local_2d8 = (undefined1  [16])0x0;
    local_2f8._16_8_ = 0.0;
    local_2f8._24_8_ = 0.0;
    local_2f8._0_8_ = 0.0;
    local_2f8._8_8_ = 0.0;
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      do {
        uVar53 = 0x3ff0000000000000;
        if (lVar29 != lVar32) {
          uVar53 = 0;
        }
        *(undefined8 *)(puVar20 + lVar32) = uVar53;
        lVar32 = lVar32 + 0x18;
      } while (lVar32 != 0x60);
      lVar31 = lVar31 + 1;
      puVar20 = puVar20 + 8;
      lVar29 = lVar29 + 0x18;
    } while (lVar31 != 3);
    puVar20 = local_188;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar21 + lVar31) = *(undefined8 *)(puVar20 + lVar31 * 4);
        lVar31 = lVar31 + 8;
      } while (lVar31 != 0x18);
      lVar29 = lVar29 + 1;
      puVar21 = puVar21 + 0x18;
      puVar20 = puVar20 + 8;
    } while (lVar29 != 4);
    puVar20 = local_298;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31) = *(undefined8 *)(puVar27 + lVar31);
        lVar31 = lVar31 + 0x18;
      } while (lVar31 != 0x60);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 8;
      puVar27 = puVar27 + 8;
    } while (lVar29 != 3);
    puVar20 = local_2d8;
    local_2a8 = (undefined1  [16])0x0;
    local_2b8 = (undefined1  [16])0x0;
    local_2c8 = (undefined1  [16])0x0;
    local_2d8 = (undefined1  [16])0x0;
    local_2f8._16_8_ = 0.0;
    local_2f8._24_8_ = 0.0;
    local_2f8._0_8_ = 0.0;
    local_2f8._8_8_ = 0.0;
    lVar29 = 0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      auVar50 = _DAT_019f34d0;
      do {
        bVar52 = SUB164(auVar50 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar50 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar32 + -0x20) = uVar53;
        }
        if (bVar52) {
          uVar53 = 0x3ff0000000000000;
          if (lVar29 + -0x20 != lVar32) {
            uVar53 = 0;
          }
          *(undefined8 *)(puVar20 + lVar32) = uVar53;
        }
        lVar51 = auVar50._8_8_;
        auVar50._0_8_ = auVar50._0_8_ + 2;
        auVar50._8_8_ = lVar51 + 2;
        lVar32 = lVar32 + 0x40;
      } while (lVar32 != 0x80);
      lVar31 = lVar31 + 1;
      lVar29 = lVar29 + 0x20;
      puVar20 = puVar20 + 8;
    } while (lVar31 != 4);
    lVar29 = 0;
    do {
      uVar53 = *(undefined8 *)((long)local_d8 + lVar29);
      uVar3 = *(undefined8 *)(local_f8 + lVar29 + 8);
      uVar4 = *(undefined8 *)((long)local_d8 + lVar29 + 0x18);
      *(undefined8 *)(local_2f8 + lVar29 * 4) = *(undefined8 *)(local_108 + lVar29);
      *(undefined8 *)(local_2f8 + lVar29 * 4 + 8) = uVar3;
      *(undefined8 *)(local_2f8 + lVar29 * 4 + 0x10) = uVar53;
      *(undefined8 *)(local_2d8 + lVar29 * 4 + -8) = uVar4;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x18);
    puVar20 = local_218;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31) = *(undefined8 *)(puVar28 + lVar31);
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x60);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 8;
      puVar28 = puVar28 + 8;
    } while (lVar29 != 4);
    apuStack_318[3] = (undefined1 *)0x93c95c;
    tcu::operator*((Matrix<double,_3,_3> *)local_2f8,(Matrix<double,_3,_4> *)local_298,
                   (Matrix<double,_4,_3> *)local_218);
    puVar20 = local_88;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar20 + lVar31) = *(undefined8 *)(puVar34 + lVar31);
        lVar31 = lVar31 + 0x18;
      } while (lVar31 != 0x48);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 8;
      puVar34 = puVar34 + 8;
    } while (lVar29 != 3);
    puVar20 = local_88;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        *(undefined8 *)(puVar22 + lVar31) = *(undefined8 *)(puVar20 + lVar31);
        lVar31 = lVar31 + 8;
      } while (lVar31 != 0x18);
      lVar29 = lVar29 + 1;
      puVar20 = puVar20 + 0x18;
      puVar22 = puVar22 + 0x18;
    } while (lVar29 != 3);
    break;
  default:
    apuStack_318[3] = (undefined1 *)0x93c9e9;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    apuStack_318[3] = (undefined1 *)0x93ca0a;
    tcu::TestError::TestError
              (this_00,"Unrecognized matrix A type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x2c2e);
    apuStack_318[3] = &LAB_0093ca20;
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  lVar29 = 9;
code_r0x0093c9cc:
  for (; lVar29 != 0; lVar29 = lVar29 + -1) {
    *out_result_ptr = *pdVar23;
    pdVar23 = pdVar23 + (ulong)bVar35 * -2 + 1;
    out_result_ptr = out_result_ptr + (ulong)bVar35 * -2 + 1;
  }
  return;
}

Assistant:

void GPUShaderFP64Test9::getMatrixMultiplicationResult(const Utils::_variable_type& matrix_a_type,
													   const std::vector<double>&   matrix_a_data,
													   const Utils::_variable_type& matrix_b_type,
													   const std::vector<double>& matrix_b_data, double* out_result_ptr)
{
	(void)matrix_b_type;
	using namespace tcu;
	/* To keep the code maintainable, we only consider cases relevant for this test */
	switch (matrix_a_type)
	{
	case Utils::VARIABLE_TYPE_DMAT2:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT2);

		tcu::Matrix2d matrix_a(&matrix_a_data[0]);
		tcu::Matrix2d matrix_b(&matrix_b_data[0]);
		tcu::Matrix2d result;

		matrix_a = transpose(matrix_a);
		matrix_b = transpose(matrix_b);
		result   = matrix_a * matrix_b;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 2 * 2);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT2X3:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT3X2);

		tcu::Matrix<double, 2, 3> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 3, 2> matrix_a_transposed;
		tcu::Matrix<double, 3, 2> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 2, 3> matrix_b_transposed;
		tcu::Matrix<double, 3, 3> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 3 * 3);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT2X4:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT4X2);

		tcu::Matrix<double, 2, 4> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 4, 2> matrix_a_transposed;
		tcu::Matrix<double, 4, 2> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 2, 4> matrix_b_transposed;
		tcu::Matrix<double, 4, 4> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 4 * 4);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT3:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT3);

		tcu::Matrix<double, 3, 3> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 3, 3> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 3, 3> result;

		matrix_a = transpose(matrix_a);
		matrix_b = transpose(matrix_b);
		result   = matrix_a * matrix_b;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 3 * 3);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT3X2:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT2X3);

		tcu::Matrix<double, 3, 2> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 2, 3> matrix_a_transposed;
		tcu::Matrix<double, 2, 3> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 3, 2> matrix_b_transposed;
		tcu::Matrix<double, 2, 2> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 2 * 2);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT3X4:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT4X3);

		tcu::Matrix<double, 3, 4> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 4, 3> matrix_a_transposed;
		tcu::Matrix<double, 4, 3> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 3, 4> matrix_b_transposed;
		tcu::Matrix<double, 4, 4> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 4 * 4);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT4:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT4);

		tcu::Matrix<double, 4, 4> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 4, 4> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 4, 4> result;

		matrix_a = transpose(matrix_a);
		matrix_b = transpose(matrix_b);
		result   = matrix_a * matrix_b;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 4 * 4);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT4X2:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT2X4);

		tcu::Matrix<double, 4, 2> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 2, 4> matrix_a_transposed;
		tcu::Matrix<double, 2, 4> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 4, 2> matrix_b_transposed;
		tcu::Matrix<double, 2, 2> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 2 * 2);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT4X3:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT3X4);

		tcu::Matrix<double, 4, 3> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 3, 4> matrix_a_transposed;
		tcu::Matrix<double, 3, 4> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 4, 3> matrix_b_transposed;
		tcu::Matrix<double, 3, 3> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 3 * 3);
		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized matrix A type");
	}
	} /* switch (matrix_a_type) */
}